

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRDBoard.cpp
# Opt level: O1

void __thiscall BRDBoard::BRDBoard(BRDBoard *this,BRDFileBase *boardFile)

{
  SharedVector<Component> *this_00;
  _Rb_tree_node_base *__x;
  pointer *pppVar1;
  pointer ppVar2;
  iterator __position;
  pointer pcVar3;
  size_type sVar4;
  pointer psVar5;
  char *__s;
  char *pcVar6;
  shared_ptr<Component> *psVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer psVar10;
  Point PVar11;
  pointer pBVar12;
  BRDBoard *pBVar13;
  SharedVector<Net> *this_02;
  char cVar14;
  char cVar15;
  uint uVar16;
  int iVar17;
  Component *__tmp;
  mapped_type *pmVar18;
  value_type *pvVar19;
  const_iterator cVar20;
  shared_ptr<Component> *psVar21;
  _Rb_tree_node_base *p_Var22;
  long *plVar23;
  EBoardSide EVar24;
  long lVar25;
  pointer pBVar26;
  undefined8 *puVar27;
  iterator __first;
  ulong uVar28;
  ulong uVar29;
  pointer pBVar30;
  string *psVar31;
  pointer pBVar32;
  pointer ppVar33;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  __i;
  shared_ptr<Component> *psVar34;
  pointer psVar35;
  bool bVar36;
  shared_ptr<Pin> pin;
  shared_ptr<Net> net_nc;
  string net_name;
  shared_ptr<Net> net_1;
  shared_ptr<Component> comp_dummy;
  shared_ptr<Net> net;
  SharedStringMap<Net> net_map;
  shared_ptr<Component> comp_1;
  vector<BRDPoint,_std::allocator<BRDPoint>_> m_points;
  vector<BRDNail,_std::allocator<BRDNail>_> m_nails;
  vector<BRDPin,_std::allocator<BRDPin>_> m_pins;
  vector<BRDPart,_std::allocator<BRDPart>_> m_parts;
  value_type local_248;
  uint local_234;
  vector<BRDPin,_std::allocator<BRDPin>_> local_230;
  BRDBoard *local_218;
  long *local_210;
  uint local_208;
  undefined4 uStack_204;
  long local_200 [2];
  SharedVector<Net> *local_1f0;
  element_type *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  value_type local_1d8;
  vector<BRDPart,_std::allocator<BRDPart>_> local_1c8;
  undefined1 local_1b0 [8];
  Point PStack_1a8;
  _Base_ptr local_1a0;
  _Rb_tree_node_base *local_198;
  _Rb_tree_node_base *local_190;
  size_t local_188;
  vector<std::pair<Point,Point>,std::allocator<std::pair<Point,Point>>> *local_180;
  value_type local_178;
  int iStack_164;
  SharedVector<Pin> *local_160;
  SharedVector<Point> *local_158;
  long *local_150;
  ulong local_148;
  long local_140 [2];
  long *local_130;
  ulong local_128;
  long local_120 [2];
  long *local_110;
  ulong local_108;
  long local_100 [2];
  vector<BRDPoint,_std::allocator<BRDPoint>_> local_f0;
  vector<BRDNail,_std::allocator<BRDNail>_> local_d8;
  vector<BRDPin,_std::allocator<BRDPin>_> local_c0;
  vector<BRDPart,_std::allocator<BRDPart>_> local_a8;
  long *local_90;
  ulong local_88;
  long local_80 [2];
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  (this->super_Board)._vptr_Board = (_func_int **)&PTR__BRDBoard_0022df88;
  this->m_file = boardFile;
  this_00 = &this->components_;
  local_160 = &this->pins_;
  local_158 = &this->outline_points_;
  local_180 = (vector<std::pair<Point,Point>,std::allocator<std::pair<Point,Point>>> *)
              &this->outline_segments_;
  (this->nets_).super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nets_).super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nets_).super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->components_).
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->components_).
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->components_).
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pins_).super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pins_).super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pins_).super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outline_points_).
  super__Vector_base<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outline_points_).
  super__Vector_base<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outline_points_).
  super__Vector_base<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outline_segments_).
  super__Vector_base<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outline_segments_).
  super__Vector_base<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outline_segments_).
  super__Vector_base<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<BRDPart,_std::allocator<BRDPart>_>::vector
            (&local_a8,(ulong)boardFile->num_parts,(allocator_type *)local_1b0);
  std::vector<BRDPin,_std::allocator<BRDPin>_>::vector
            (&local_c0,(ulong)this->m_file->num_pins,(allocator_type *)local_1b0);
  std::vector<BRDNail,_std::allocator<BRDNail>_>::vector
            (&local_d8,(ulong)this->m_file->num_nails,(allocator_type *)local_1b0);
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::vector
            (&local_f0,(ulong)this->m_file->num_format,(allocator_type *)local_1b0);
  std::vector<BRDPart,_std::allocator<BRDPart>_>::operator=(&local_a8,&this->m_file->parts);
  std::vector<BRDPin,_std::allocator<BRDPin>_>::operator=(&local_c0,&this->m_file->pins);
  std::vector<BRDNail,_std::allocator<BRDNail>_>::operator=(&local_d8,&this->m_file->nails);
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::operator=(&local_f0,&this->m_file->format);
  local_218 = this;
  if (local_f0.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_f0.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar32 = local_f0.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_1b0._0_4_ = 0.0;
      local_1b0._4_4_ = 0.0;
      PStack_1a8 = (Point)operator_new(0x18);
      *(undefined8 *)((long)PStack_1a8 + 8) = 0x100000001;
      *(undefined ***)PStack_1a8 = &PTR___Sp_counted_ptr_inplace_0022dff8;
      local_1b0 = (undefined1  [8])((long)PStack_1a8 + 0x10);
      *(ulong *)((long)PStack_1a8 + 0x10) = CONCAT44((float)(*pBVar32).y,(float)(*pBVar32).x);
      std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::push_back
                (local_158,(value_type *)local_1b0);
      if (PStack_1a8 != (Point)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)PStack_1a8);
      }
      pBVar32 = pBVar32 + 1;
    } while (pBVar32 !=
             local_f0.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  pBVar13 = local_218;
  std::vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>::reserve
            ((vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_> *)local_180
             ,(long)(local_218->m_file->outline_segments).
                    super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_218->m_file->outline_segments).
                    super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
  ppVar33 = (pBVar13->m_file->outline_segments).
            super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (pBVar13->m_file->outline_segments).
           super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar33 != ppVar2) {
    do {
      local_1b0._0_4_ = (undefined4)(ppVar33->first).x;
      local_1b0._4_4_ = (undefined4)(ppVar33->first).y;
      PStack_1a8.y = (float)(ppVar33->second).y;
      PStack_1a8.x = (float)(ppVar33->second).x;
      __position._M_current =
           (pBVar13->outline_segments_).
           super__Vector_base<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pBVar13->outline_segments_).
          super__Vector_base<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<Point,Point>,std::allocator<std::pair<Point,Point>>>::
        _M_realloc_insert<std::pair<Point,Point>>
                  (local_180,__position,(pair<Point,_Point> *)local_1b0);
      }
      else {
        ((__position._M_current)->first).x = (float)local_1b0._0_4_;
        ((__position._M_current)->first).y = (float)local_1b0._4_4_;
        (__position._M_current)->second = PStack_1a8;
        pppVar1 = &(pBVar13->outline_segments_).
                   super__Vector_base<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      ppVar33 = ppVar33 + 1;
    } while (ppVar33 != ppVar2);
  }
  local_198 = (_Rb_tree_node_base *)&PStack_1a8;
  PStack_1a8 = (Point)((ulong)PStack_1a8 & 0xffffffff00000000);
  local_1a0 = (_Base_ptr)0x0;
  local_188 = 0;
  local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f0 = &this->nets_;
  local_190 = local_198;
  local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)operator_new(0x60);
  *(undefined8 *)
   &(((element_type *)
     local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
     _M_finish)->super_BoardElement).board_side = 0x100000001;
  (((element_type *)
   local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->super_BoardElement)._vptr_BoardElement =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0022e0a8;
  local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&((element_type *)
                       local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                       super__Vector_impl_data._M_finish)->name;
  (((element_type *)
   local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->name)._M_dataplus._M_p = (pointer)0x0;
  (((element_type *)
   local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->name)._M_string_length = 0;
  (((element_type *)
   local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->name).field_2._M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)&(((element_type *)
            local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
            super__Vector_impl_data._M_finish)->name).field_2 + 8) = 0;
  *(undefined8 *)
   &((element_type *)
    local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
    _M_finish)->is_ground = 0;
  (((element_type *)
   local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->pins).
  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (((element_type *)
   ((long)local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
          super__Vector_impl_data._M_finish + 0x50))->super_BoardElement)._vptr_BoardElement =
       (_func_int **)0x0;
  *(undefined8 *)
   &(((element_type *)
     ((long)local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
            super__Vector_impl_data._M_finish + 0x50))->super_BoardElement).board_side = 0;
  (((element_type *)
   local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->pins).
  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (((element_type *)
   local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->pins).
  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)
   &(((element_type *)
     local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
     _M_finish)->name)._M_string_length = 2;
  (((element_type *)
   local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->name)._M_dataplus._M_p = (pointer)&PTR_UniqueId_abi_cxx11__0022e0f8;
  (((element_type *)
   local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->name).field_2._M_allocated_capacity =
       (size_type)
       &((element_type *)
        local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
        super__Vector_impl_data._M_finish)->is_ground;
  *(undefined8 *)
   ((long)&(((element_type *)
            local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
            super__Vector_impl_data._M_finish)->name).field_2 + 8) = 0;
  ((element_type *)
  local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
  _M_finish)->is_ground = false;
  *(undefined8 *)
   &(((element_type *)
     ((long)local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
            super__Vector_impl_data._M_finish + 0x50))->super_BoardElement).board_side = 0;
  (((element_type *)
   local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
   _M_finish)->pins).
  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((element_type *)
   ((long)local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
          super__Vector_impl_data._M_finish + 0x50))->super_BoardElement)._vptr_BoardElement =
       (_func_int **)0x0;
  std::__cxx11::string::_M_assign
            ((string *)
             (((element_type *)
              local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
              super__Vector_impl_data._M_finish)->name).field_2._M_local_buf);
  *(undefined1 *)
   &(local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
    _M_start)->name = 0;
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                          *)local_1b0,
                         (key_type *)
                         &(local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                           super__Vector_impl_data._M_start)->side);
  (pmVar18->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)
       local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data
       ._M_start;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar18->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
              super__Vector_impl_data._M_finish);
  if (local_d8.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      local_d8.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    pBVar30 = local_d8.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)operator_new(0x60);
      ((local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
        super__Vector_impl_data._M_finish)->mfgcode)._M_dataplus._M_p = (pointer)0x100000001;
      (local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
       super__Vector_impl_data._M_finish)->name = (char *)&PTR___Sp_counted_ptr_inplace_0022e0a8;
      local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&((local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                       super__Vector_impl_data._M_finish)->mfgcode)._M_string_length;
      ((local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
        super__Vector_impl_data._M_finish)->mfgcode)._M_string_length = 0;
      ((local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
        super__Vector_impl_data._M_finish)->mfgcode).field_2._M_allocated_capacity = 0;
      *(undefined8 *)
       ((long)&((local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                 super__Vector_impl_data._M_finish)->mfgcode).field_2 + 8) = 0;
      (local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
       super__Vector_impl_data._M_finish)->mounting_side = Both;
      (local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
       super__Vector_impl_data._M_finish)->part_type = SMD;
      (local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
       super__Vector_impl_data._M_finish)->end_of_pins = 0;
      ((local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
        super__Vector_impl_data._M_finish)->p1).x = 0;
      *(undefined8 *)
       &((local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
          super__Vector_impl_data._M_finish)->p1).y = 0;
      local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
      super__Vector_impl_data._M_finish[1].mfgcode._M_dataplus._M_p = (pointer)0x0;
      local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
      super__Vector_impl_data._M_finish[1].mfgcode._M_string_length = 0;
      *(undefined8 *)
       &((local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
          super__Vector_impl_data._M_finish)->p2).y = 0;
      local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
      super__Vector_impl_data._M_finish[1].name = (char *)0x0;
      *(undefined4 *)
       &((local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
          super__Vector_impl_data._M_finish)->mfgcode).field_2 = 2;
      ((local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
        super__Vector_impl_data._M_finish)->mfgcode)._M_string_length =
           (size_type)&PTR_UniqueId_abi_cxx11__0022e0f8;
      *(uint **)((long)&((local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                          super__Vector_impl_data._M_finish)->mfgcode).field_2 + 8) =
           &(local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
             super__Vector_impl_data._M_finish)->end_of_pins;
      (local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
       super__Vector_impl_data._M_finish)->mounting_side = Both;
      (local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
       super__Vector_impl_data._M_finish)->part_type = SMD;
      *(undefined1 *)
       &(local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
         super__Vector_impl_data._M_finish)->end_of_pins = 0;
      local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
      super__Vector_impl_data._M_finish[1].mfgcode._M_string_length = 0;
      local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
      super__Vector_impl_data._M_finish[1].name = (char *)0x0;
      local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
      super__Vector_impl_data._M_finish[1].mfgcode._M_dataplus._M_p = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,pBVar30->net,(allocator<char> *)&local_1d8);
      std::__cxx11::string::operator=
                ((string *)
                 ((long)local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                        super__Vector_impl_data._M_start + 0x10),(string *)&local_210);
      if (local_210 != local_200) {
        operator_delete(local_210,local_200[0] + 1);
      }
      local_110 = local_100;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,kNetUnconnectedPrefix_abi_cxx11_._M_dataplus._M_p,
                 kNetUnconnectedPrefix_abi_cxx11_._M_dataplus._M_p +
                 kNetUnconnectedPrefix_abi_cxx11_._M_string_length);
      pcVar3 = (((string *)
                ((long)local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                       super__Vector_impl_data._M_start + 0x10))->_M_dataplus)._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,
                 pcVar3 + ((string *)
                          ((long)local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 0x10))->_M_string_length
                );
      if (local_48 < local_108) {
        bVar36 = false;
      }
      else {
        plVar23 = local_110;
        if (local_108 != 0) {
          uVar28 = 0;
          do {
            if (*(char *)((long)local_110 + uVar28) != *(char *)((long)local_50 + uVar28)) {
              plVar23 = (long *)((long)local_110 + uVar28);
              break;
            }
            uVar28 = uVar28 + 1;
            plVar23 = (long *)((long)local_110 + local_108);
          } while (local_108 != uVar28);
        }
        bVar36 = plVar23 == (long *)((long)local_110 + local_108);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (local_110 != local_100) {
        operator_delete(local_110,local_100[0] + 1);
      }
      if (!bVar36) {
        *(uint *)&((BoardElement *)
                  &(local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                    super__Vector_impl_data._M_start)->name)->field_0xc = pBVar30->probe;
        ((BoardElement *)
        &(local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
          super__Vector_impl_data._M_start)->name)->board_side = (uint)(pBVar30->side != Top);
        pmVar18 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                                *)local_1b0,
                               (string *)
                               ((long)local_1c8.
                                      super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                                      super__Vector_impl_data._M_start + 0x10));
        (pmVar18->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)
             local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
             super__Vector_impl_data._M_start;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pmVar18->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                    super__Vector_impl_data._M_finish);
      }
      if (local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_1c8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      }
      pBVar30 = pBVar30 + 1;
    } while (pBVar30 !=
             local_d8.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if ((element_type *)
      local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
      _M_finish != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  if (local_a8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      local_a8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    pBVar26 = local_a8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Component,std::allocator<Component>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                  super__Vector_impl_data._M_finish,(Component **)&local_230,
                 (allocator<Component> *)&local_210);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,pBVar26->name,(allocator<char> *)&local_1c8);
      std::__cxx11::string::operator=
                ((string *)
                 &((string *)
                  &(local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                    super__Vector_impl_data._M_start)->side)->_M_string_length,(string *)&local_210)
      ;
      if (local_210 != local_200) {
        operator_delete(local_210,local_200[0] + 1);
      }
      std::__cxx11::string::operator=
                ((string *)
                 ((long)local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                        super__Vector_impl_data._M_start + 0x38),(string *)&pBVar26->mfgcode);
      (((element_type *)
       ((long)local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
              super__Vector_impl_data._M_start + 0x50))->pins).
      super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT44((float)(pBVar26->p1).y,(float)(pBVar26->p1).x);
      (((element_type *)
       ((long)local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
              super__Vector_impl_data._M_start + 0x50))->pins).
      super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44((float)(pBVar26->p2).y,(float)(pBVar26->p2).x);
      local_130 = local_120;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,kComponentDummyName_abi_cxx11_._M_dataplus._M_p,
                 kComponentDummyName_abi_cxx11_._M_dataplus._M_p +
                 kComponentDummyName_abi_cxx11_._M_string_length);
      sVar4 = ((string *)
              &(local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                super__Vector_impl_data._M_start)->side)->_M_string_length;
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,sVar4,
                 sVar4 + (((string *)
                          &(local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                            super__Vector_impl_data._M_start)->side)->field_2)._M_allocated_capacity
                );
      if (local_68 < local_128) {
        bVar36 = false;
      }
      else {
        plVar23 = local_130;
        if (local_128 != 0) {
          uVar28 = 0;
          do {
            if (*(char *)((long)local_130 + uVar28) != *(char *)((long)local_70 + uVar28)) {
              plVar23 = (long *)((long)local_130 + uVar28);
              break;
            }
            uVar28 = uVar28 + 1;
            plVar23 = (long *)((long)local_130 + local_128);
          } while (local_128 != uVar28);
        }
        bVar36 = plVar23 == (long *)((long)local_130 + local_128);
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      if (local_130 != local_120) {
        operator_delete(local_130,local_120[0] + 1);
      }
      if (bVar36) {
        *(undefined4 *)
         &(((string *)
           &(local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
             super__Vector_impl_data._M_start)->side)->_M_dataplus)._M_p = 1;
      }
      EVar24 = (pBVar26->mounting_side != Bottom) + kBoardSideBottom;
      if (pBVar26->mounting_side == Top) {
        EVar24 = kBoardSideTop;
      }
      ((BoardElement *)
      &(local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
        super__Vector_impl_data._M_start)->pos)->board_side = EVar24;
      *(uint *)&((BoardElement *)
                &(local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                  super__Vector_impl_data._M_start)->pos)->field_0xc =
           2 - (uint)(pBVar26->part_type == SMD);
      std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
      push_back(this_00,(value_type *)&local_230);
      if ((element_type *)
          local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
          super__Vector_impl_data._M_finish != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      }
      pBVar26 = pBVar26 + 1;
    } while (pBVar26 !=
             local_a8.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_1d8.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Component,std::allocator<Component>>
            (&local_1d8.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Component **)&local_1d8,(allocator<Component> *)&local_210);
  std::__cxx11::string::_M_assign
            ((string *)
             &(local_1d8.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name);
  (local_1d8.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->component_type =
       kComponentTypeDummy;
  std::vector<BRDPin,_std::allocator<BRDPin>_>::vector(&local_230,&local_c0);
  std::vector<BRDPart,_std::allocator<BRDPart>_>::vector(&local_1c8,&local_a8);
  if (local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_234 = 0;
    iVar17 = 1;
    uVar28 = 0;
    do {
      pBVar12 = local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar16 = *(int *)((long)&(local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                _M_impl.super__Vector_impl_data._M_start)->pos + uVar28 * 0x38 + 0xc
                       ) - 1;
      psVar5 = (this_00->
               super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_178.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           psVar5[uVar16].super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_178.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           psVar5[uVar16].super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_178.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_178.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_178.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_178.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_178.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (local_178.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Pin,std::allocator<Pin>>
                  (&local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (Pin **)&local_248,(allocator<Pin> *)&local_210);
        if ((local_178.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            component_type == kComponentTypeDummy) {
          *(undefined4 *)
           &((local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_BoardElement).field_0xc = 4;
          ((local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->component).
          super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_1d8.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&((local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      component).super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &local_1d8.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          pvVar19 = &local_1d8;
        }
        else {
          *(undefined4 *)
           &((local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_BoardElement).field_0xc = 2;
          ((local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->component).
          super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_178.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&((local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      component).super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &local_178.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          pvVar19 = &local_178;
        }
        std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::push_back
                  (&((pvVar19->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    pins,&local_248);
        puVar27 = (undefined8 *)((long)&pBVar12->pos + uVar28 * 0x38);
        iStack_164 = *(int *)((long)puVar27 + 0xc);
        cVar15 = '\x01';
        local_234 = local_234 + 1;
        if (iStack_164 != iVar17) {
          local_234 = 1;
        }
        __s = (char *)puVar27[5];
        if (__s == (char *)0x0) {
          if (9 < local_234) {
            uVar16 = local_234;
            cVar14 = '\x04';
            do {
              cVar15 = cVar14;
              if (uVar16 < 100) {
                cVar15 = cVar15 + -2;
                goto LAB_0012200c;
              }
              if (uVar16 < 1000) {
                cVar15 = cVar15 + -1;
                goto LAB_0012200c;
              }
              if (uVar16 < 10000) goto LAB_0012200c;
              bVar36 = 99999 < uVar16;
              uVar16 = uVar16 / 10000;
              cVar14 = cVar15 + '\x04';
            } while (bVar36);
            cVar15 = cVar15 + '\x01';
          }
LAB_0012200c:
          local_210 = local_200;
          std::__cxx11::string::_M_construct((ulong)&local_210,cVar15);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_210,local_208,local_234);
          std::__cxx11::string::operator=
                    ((string *)
                     &(local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->number
                     ,(string *)&local_210);
          if (local_210 != local_200) {
            operator_delete(local_210,local_200[0] + 1);
          }
        }
        else {
          pcVar6 = (char *)((local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           number)._M_string_length;
          psVar31 = &(local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->number;
          strlen(__s);
          std::__cxx11::string::_M_replace((ulong)psVar31,0,pcVar6,(ulong)__s);
        }
        if (puVar27[6] == 0) {
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_210,(char *)puVar27[6],(allocator<char> *)&local_1e8);
          std::__cxx11::string::operator=
                    ((string *)
                     &(local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name,
                     (string *)&local_210);
          if (local_210 != local_200) {
            operator_delete(local_210,local_200[0] + 1);
          }
        }
        PVar11.y = (float)(int)((ulong)*puVar27 >> 0x20);
        PVar11.x = (float)(int)*puVar27;
        (local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->position = PVar11;
        EVar24 = (*(int *)(puVar27 + 2) != 1) + kBoardSideBottom;
        if (*(int *)(puVar27 + 2) == 2) {
          EVar24 = kBoardSideTop;
        }
        ((local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_BoardElement)
        .board_side = EVar24;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,(char *)puVar27[3],(allocator<char> *)&local_1e8);
        cVar20 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                         *)local_1b0,(key_type *)&local_210);
        if (cVar20._M_node == (_Base_ptr)&PStack_1a8) {
          if (CONCAT44(uStack_204,local_208) == 0) {
            pmVar18 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                                    *)local_1b0,&kNetUnconnectedPrefix_abi_cxx11_);
          }
          else {
            local_150 = local_140;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,kNetUnconnectedPrefix_abi_cxx11_._M_dataplus._M_p,
                       kNetUnconnectedPrefix_abi_cxx11_._M_dataplus._M_p +
                       kNetUnconnectedPrefix_abi_cxx11_._M_string_length);
            local_90 = local_80;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,local_210,
                       (long)local_210 + CONCAT44(uStack_204,local_208));
            if (local_88 < local_148) {
              bVar36 = false;
            }
            else {
              plVar23 = local_150;
              if (local_148 != 0) {
                uVar29 = 0;
                do {
                  if (*(char *)((long)local_150 + uVar29) != *(char *)((long)local_90 + uVar29)) {
                    plVar23 = (long *)((long)local_150 + uVar29);
                    break;
                  }
                  uVar29 = uVar29 + 1;
                  plVar23 = (long *)((long)local_150 + local_148);
                } while (local_148 != uVar29);
              }
              bVar36 = plVar23 == (long *)((long)local_150 + local_148);
            }
            if (local_90 != local_80) {
              operator_delete(local_90,local_80[0] + 1);
            }
            if (local_150 != local_140) {
              operator_delete(local_150,local_140[0] + 1);
            }
            if (!bVar36) {
              local_1e8 = (element_type *)0x0;
              local_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
              (local_1e0._M_pi)->_M_use_count = 1;
              (local_1e0._M_pi)->_M_weak_count = 1;
              (local_1e0._M_pi)->_vptr__Sp_counted_base =
                   (_func_int **)&PTR___Sp_counted_ptr_inplace_0022e0a8;
              local_1e8 = (element_type *)(local_1e0._M_pi + 1);
              local_1e0._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
              local_1e0._M_pi[1]._M_use_count = 0;
              local_1e0._M_pi[1]._M_weak_count = 0;
              local_1e0._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
              local_1e0._M_pi[2]._M_use_count = 0;
              local_1e0._M_pi[2]._M_weak_count = 0;
              local_1e0._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
              local_1e0._M_pi[3]._M_use_count = 0;
              local_1e0._M_pi[3]._M_weak_count = 0;
              local_1e0._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
              local_1e0._M_pi[5]._M_use_count = 0;
              local_1e0._M_pi[5]._M_weak_count = 0;
              local_1e0._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
              local_1e0._M_pi[4]._M_use_count = 0;
              local_1e0._M_pi[4]._M_weak_count = 0;
              local_1e0._M_pi[1]._M_use_count = 2;
              local_1e0._M_pi[1]._vptr__Sp_counted_base =
                   (_func_int **)&PTR_UniqueId_abi_cxx11__0022e0f8;
              local_1e0._M_pi[2]._vptr__Sp_counted_base = (_func_int **)(local_1e0._M_pi + 3);
              local_1e0._M_pi[2]._M_use_count = 0;
              local_1e0._M_pi[2]._M_weak_count = 0;
              *(undefined1 *)&local_1e0._M_pi[3]._vptr__Sp_counted_base = 0;
              local_1e0._M_pi[5]._M_use_count = 0;
              local_1e0._M_pi[5]._M_weak_count = 0;
              local_1e0._M_pi[4]._M_use_count = 0;
              local_1e0._M_pi[4]._M_weak_count = 0;
              local_1e0._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
              std::__cxx11::string::_M_assign((string *)(local_1e0._M_pi + 2));
              (local_1e8->super_BoardElement).board_side =
                   ((local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   super_BoardElement).board_side;
              pmVar18 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                                      *)local_1b0,(key_type *)&local_210);
              (pmVar18->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_1e8;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&(pmVar18->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                         ,&local_1e0);
              (local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net =
                   local_1e8;
              if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
              }
              goto LAB_00122364;
            }
            pmVar18 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                                    *)local_1b0,&kNetUnconnectedPrefix_abi_cxx11_);
          }
          (local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net =
               (pmVar18->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          *(undefined4 *)
           &((local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_BoardElement).field_0xc = 1;
        }
        else {
          pmVar18 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                                  *)local_1b0,(key_type *)&local_210);
          (local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net =
               (pmVar18->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        }
LAB_00122364:
        (local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->diameter =
             (float)(double)puVar27[4];
        std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::push_back
                  (&(local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net->
                    pins,&local_248);
        std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::push_back
                  (local_160,&local_248);
        if (local_210 != local_200) {
          operator_delete(local_210,local_200[0] + 1);
        }
        iVar17 = iStack_164;
        if (local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_248.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                    );
          iVar17 = iStack_164;
        }
      }
      if (local_178.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 < (ulong)(((long)local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  this_02 = local_1f0;
  pBVar13 = local_218;
  psVar34 = (local_218->components_).
            super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar7 = (local_218->components_).
           super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar25 = (long)psVar7 - (long)psVar34 >> 6;
  psVar21 = psVar34;
  if (0 < lVar25) {
    psVar21 = (shared_ptr<Component> *)
              ((long)&(psVar34->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
              ((long)psVar7 - (long)psVar34 & 0xffffffffffffffc0U));
    lVar25 = lVar25 + 1;
    __first._M_current = psVar34 + 2;
    do {
      if ((__first._M_current[-2].super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->component_type == kComponentTypeDummy) {
        __first._M_current = __first._M_current + -2;
        goto LAB_001224d3;
      }
      if ((__first._M_current[-1].super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->component_type == kComponentTypeDummy) {
        __first._M_current = __first._M_current + -1;
        goto LAB_001224d3;
      }
      if ((((__first._M_current)->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          ->component_type == kComponentTypeDummy) goto LAB_001224d3;
      if ((__first._M_current[1].super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          component_type == kComponentTypeDummy) {
        __first._M_current = __first._M_current + 1;
        goto LAB_001224d3;
      }
      lVar25 = lVar25 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar25);
  }
  lVar25 = (long)psVar7 - (long)psVar21 >> 4;
  if (lVar25 != 1) {
    if (lVar25 != 2) {
      __first._M_current = psVar7;
      if ((lVar25 != 3) ||
         (__first._M_current = psVar21,
         ((psVar21->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
         component_type == kComponentTypeDummy)) goto LAB_001224d3;
      psVar21 = psVar21 + 1;
    }
    __first._M_current = psVar21;
    if (((psVar21->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        component_type == kComponentTypeDummy) goto LAB_001224d3;
    psVar21 = psVar21 + 1;
  }
  __first._M_current = psVar21;
  if (((psVar21->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->component_type
      != kComponentTypeDummy) {
    __first._M_current = psVar7;
  }
LAB_001224d3:
  psVar34 = __first._M_current + 1;
  if (psVar34 != psVar7 && __first._M_current != psVar7) {
    do {
      peVar8 = (psVar34->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar8->component_type != kComponentTypeDummy) {
        p_Var9 = (psVar34->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi;
        (psVar34->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x0;
        (psVar34->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ((__first._M_current)->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             peVar8;
        this_01 = ((__first._M_current)->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        ((__first._M_current)->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = p_Var9;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        __first._M_current = __first._M_current + 1;
      }
      psVar34 = psVar34 + 1;
    } while (psVar34 != psVar7);
  }
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::_M_erase
            (this_00,__first,
             (pBVar13->components_).
             super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::push_back
            (this_00,&local_1d8);
  std::vector<BRDPart,_std::allocator<BRDPart>_>::~vector(&local_1c8);
  if ((element_type *)
      local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
      _M_start != (element_type *)0x0) {
    operator_delete(local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_230.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1d8.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d8.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  p_Var22 = local_198;
  if (local_198 != (_Rb_tree_node_base *)&PStack_1a8) {
    do {
      __x = p_Var22 + 2;
      iVar17 = std::__cxx11::string::compare((char *)(*(long *)(p_Var22 + 2) + 0x10));
      if (iVar17 == 0) {
        bVar36 = true;
      }
      else {
        iVar17 = std::__cxx11::string::compare((char *)(*(long *)__x + 0x10));
        bVar36 = iVar17 == 0;
      }
      *(bool *)(*(long *)__x + 0x30) = bVar36;
      std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::push_back
                (this_02,(value_type *)__x);
      p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22);
    } while (p_Var22 != (_Rb_tree_node_base *)&PStack_1a8);
  }
  psVar5 = (local_218->components_).
           super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar10 = (local_218->components_).
            super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 != psVar10) {
    uVar28 = (long)psVar10 - (long)psVar5 >> 4;
    lVar25 = 0x3f;
    if (uVar28 != 0) {
      for (; uVar28 >> lVar25 == 0; lVar25 = lVar25 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<BRDBoard::BRDBoard(BRDFileBase_const*)::__2>>
              (psVar5,psVar10,((uint)lVar25 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)psVar10 - (long)psVar5 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,__gnu_cxx::__ops::_Iter_comp_iter<BRDBoard::BRDBoard(BRDFileBase_const*)::__2>>
                (psVar5,psVar10);
    }
    else {
      psVar35 = psVar5 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,__gnu_cxx::__ops::_Iter_comp_iter<BRDBoard::BRDBoard(BRDFileBase_const*)::__2>>
                (psVar5,psVar35);
      for (; psVar35 != psVar10; psVar35 = psVar35 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,__gnu_cxx::__ops::_Val_comp_iter<BRDBoard::BRDBoard(BRDFileBase_const*)::__2>>
                  (psVar35);
      }
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
               *)local_1b0);
  if (local_f0.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<BRDPart,_std::allocator<BRDPart>_>::~vector(&local_a8);
  return;
}

Assistant:

BRDBoard::BRDBoard(const BRDFileBase * const boardFile)
    : m_file(boardFile) {
	// TODO: strip / trim all strings, especially those used as keys
	// TODO: just loop through original arrays?
	std::vector<BRDPart> m_parts(m_file->num_parts);
	std::vector<BRDPin> m_pins(m_file->num_pins);
	std::vector<BRDNail> m_nails(m_file->num_nails);
	std::vector<BRDPoint> m_points(m_file->num_format);

	m_parts  = m_file->parts;
	m_pins   = m_file->pins;
	m_nails  = m_file->nails;
	m_points = m_file->format;

	// Set outline
	{
		for (auto &brdPoint : m_points) {
			auto point = std::make_shared<Point>(brdPoint.x, brdPoint.y);
			outline_points_.push_back(point);
		}
	}

	outline_segments_.reserve(m_file->outline_segments.size());
	std::transform(m_file->outline_segments.begin(), m_file->outline_segments.end(), std::back_inserter(outline_segments_), [](const std::pair<BRDPoint, BRDPoint> &s) -> std::pair<Point, Point> {
		return {{s.first.x, s.first.y}, {s.second.x, s.second.y}};
	});

	// Populate map of unique nets
	SharedStringMap<Net> net_map;
	{
		// adding special net 'UNCONNECTED'
		auto net_nc           = std::make_shared<Net>();
		net_nc->name          = kNetUnconnectedPrefix;
		net_nc->is_ground     = false;
		net_map[net_nc->name] = net_nc;

		// handle all the others
		for (auto &brd_nail : m_nails) {
			auto net = std::make_shared<Net>();

			// copy NET name and number (probe)
			net->name = std::string(brd_nail.net);

			// avoid having multiple UNCONNECTED<XXX> references
			if (is_prefix(kNetUnconnectedPrefix, net->name)) continue;

			net->number    = brd_nail.probe;

			if (brd_nail.side == BRDPartMountingSide::Top) {
				net->board_side = kBoardSideTop;
			} else {
				net->board_side = kBoardSideBottom;
			}

			// so we can find nets later by name (making unique by name)
			net_map[net->name] = net;
		}
	}

	// Populate parts
	{
		for (auto &brd_part : m_parts) {
			auto comp = std::make_shared<Component>();

			comp->name    = std::string(brd_part.name);
			comp->mfgcode = std::move(brd_part.mfgcode);

			comp->p1 = {brd_part.p1.x, brd_part.p1.y};
			comp->p2 = {brd_part.p2.x, brd_part.p2.y};

			// is it some dummy component to indicate test pads?
			if (is_prefix(kComponentDummyName, comp->name)) comp->component_type = Component::kComponentTypeDummy;

			// check what side the board is on (sorcery?)
			if (brd_part.mounting_side == BRDPartMountingSide::Top) {
				comp->board_side = kBoardSideTop;
			} else if (brd_part.mounting_side == BRDPartMountingSide::Bottom) {
				comp->board_side = kBoardSideBottom;
			} else {
				comp->board_side = kBoardSideBoth;
			}

			comp->mount_type = (brd_part.part_type == BRDPartType::SMD) ? Component::kMountTypeSMD : Component::kMountTypeDIP;

			components_.push_back(comp);
		}
	}

	// Populate pins
	{
		// generate dummy component as reference
		auto comp_dummy            = std::make_shared<Component>();
		comp_dummy->name           = kComponentDummyName;
		comp_dummy->component_type = Component::kComponentTypeDummy;

		// NOTE: originally the pin diameter depended on part.name[0] == 'U' ?
		unsigned int pin_idx  = 0;
		unsigned int part_idx = 1;
		auto pins             = m_pins;
		auto parts            = m_parts;

		for (size_t i = 0; i < pins.size(); i++) {
			// (originally from BoardView::DrawPins)
			const BRDPin &brd_pin = pins[i];
			std::shared_ptr<Component> comp       = components_[brd_pin.part - 1];

			if (!comp) continue;

			auto pin = std::make_shared<Pin>();

			if (comp->is_dummy()) {
				// component is virtual, i.e. "...", pin is test pad
				pin->type      = Pin::kPinTypeTestPad;
				pin->component = comp_dummy;
				comp_dummy->pins.push_back(pin);
			} else {
				// component is regular / not virtual
				pin->type       = Pin::kPinTypeComponent;
				pin->component  = comp;
				comp->pins.push_back(pin);
			}

			// determine pin number on part
			++pin_idx;
			if (brd_pin.part != part_idx) {
				part_idx = brd_pin.part;
				pin_idx  = 1;
			}
			if (brd_pin.snum) {
				pin->number = brd_pin.snum;
			} else {
				pin->number = std::to_string(pin_idx);
			}

			// Lets us see BGA pad names finally
			//
			if (brd_pin.name) {
				pin->name = std::string(brd_pin.name);
			} else {
				pin->name = pin->number;
			}

			// copy position
			pin->position = Point(brd_pin.pos.x, brd_pin.pos.y);

			// Set board side for pins from specific setting
			if (brd_pin.side == BRDPinSide::Top) {
				pin->board_side = kBoardSideTop;
			} else if (brd_pin.side == BRDPinSide::Bottom) {
				pin->board_side = kBoardSideBottom;
			} else {
				pin->board_side = kBoardSideBoth;
			}

			// set net reference (here's our NET key string again)
			std::string net_name = std::string(brd_pin.net);
			if (net_map.count(net_name)) {
				// there is a net with that name in our map
				pin->net = net_map[net_name].get();
			} else {
				// no net with that name registered, so create one
				if (!net_name.empty()) {
					if (is_prefix(kNetUnconnectedPrefix, net_name)) {
						// pin is unconnected, so reference our special net
						pin->net  = net_map[kNetUnconnectedPrefix].get();
						pin->type = Pin::kPinTypeNotConnected;
					} else {
						// indeed a new net
						auto net        = std::make_shared<Net>();
						net->name       = net_name;
						net->board_side = pin->board_side;
						// NOTE: net->number not set
						net_map[net_name] = net;
						pin->net          = net.get();
					}
				} else {
					// not sure this can happen -> no info
					// It does happen in .fz apparently and produces a SEGFAULT… Use
					// unconnected net.
					pin->net  = net_map[kNetUnconnectedPrefix].get();
					pin->type = Pin::kPinTypeNotConnected;
				}
			}

			// TODO: should either depend on file specs or type etc
			//
			//  if(brd_pin.radius) pin->diameter = brd_pin.radius; // some format
			//  (.fz) contains a radius field
			//    else pin->diameter = 0.5f;
			pin->diameter = brd_pin.radius; // some format (.fz) contains a radius field

			pin->net->pins.push_back(pin);
			pins_.push_back(pin);
		}

		// remove all dummy components from vector, add our official dummy
		components_.erase(
		    remove_if(begin(components_), end(components_), [](std::shared_ptr<Component> &comp) { return comp->is_dummy(); }),
		    end(components_));

		components_.push_back(comp_dummy);
	}

	// Populate Net vector by using the map. (sorted by keys)
	for (auto &net : net_map) {
		// check whether the pin represents ground
		net.second->is_ground = (net.second->name == "GND" || net.second->name == "GROUND");
		nets_.push_back(net.second);
	}

	// Sort components by name
	sort(begin(components_), end(components_), [](const std::shared_ptr<Component> &lhs, const std::shared_ptr<Component> &rhs) {
		return lhs->name < rhs->name;
	});
}